

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  bool bVar1;
  uint32_t uVar2;
  Resource *pRVar3;
  Resource *pRVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  CompilerError *pCVar7;
  ulong uVar8;
  SPIRType *pSVar9;
  size_type sVar10;
  spirv_cross local_10a0 [32];
  string local_1080 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060 [32];
  string local_1040 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000 [32];
  string local_fe0 [32];
  undefined1 local_fc0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40 [32];
  spirv_cross local_f20 [32];
  string local_f00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0 [32];
  string local_ec0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80 [32];
  spirv_cross local_e60 [32];
  string local_e40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60 [32];
  SPIRType *local_d40;
  SPIRType *parent_type;
  string local_d18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8 [32];
  string local_cd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98 [32];
  spirv_cross local_c78 [32];
  TypedID<(spirv_cross::Types)0> *local_c58;
  char *cv_flags;
  Bitset *local_c48;
  Bitset *flags;
  spirv_cross local_c38 [32];
  string local_c18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8 [32];
  string local_bd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98 [32];
  spirv_cross local_b78 [32];
  string local_b58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38 [32];
  spirv_cross local_b18 [32];
  string local_af8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8 [32];
  spirv_cross local_ab8 [32];
  string local_a98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58 [32];
  SPIRType *local_a38;
  SPIRType *basetype;
  string local_a10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0 [32];
  spirv_cross local_9d0 [32];
  string local_9b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990 [32];
  undefined1 local_970 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930 [32];
  spirv_cross local_910 [32];
  string local_8f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0 [32];
  string local_8b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850 [39];
  allocator local_829;
  string local_828 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [36];
  uint32_t local_7a4;
  undefined1 local_7a0 [68];
  uint local_75c;
  spirv_cross local_758 [32];
  string local_738 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718 [32];
  spirv_cross local_6f8 [32];
  string local_6d8 [32];
  undefined1 local_6b8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8 [32];
  uint local_5b8;
  uint local_5b4;
  uint32_t i;
  uint32_t array_size;
  string local_590 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570 [32];
  string local_550 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530 [32];
  string local_510 [32];
  undefined1 local_4f0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [32];
  string local_450 [32];
  undefined1 local_430 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0 [36];
  uint32_t local_38c;
  char local_385;
  uint32_t local_384;
  spirv_cross local_380 [3];
  bool ssbo;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  undefined1 local_320 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  ID local_2c0;
  uint32_t local_2bc;
  ID local_2b8;
  uint32_t local_2b4;
  spirv_cross local_2b0 [8];
  string primary_name;
  mapped_type *m;
  SPIRType *pSStack_280;
  uint32_t var_id;
  SPIRType *type;
  SPIRVariable *var;
  Resource *r;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<Resource,_8UL> *__range1;
  anon_class_16_2_ef385292 local_240;
  undefined1 local_230 [8];
  SmallVector<Resource,_8UL> resources;
  string *ep_args_local;
  CompilerMSL *this_local;
  
  resources.stack_storage.aligned_char._504_8_ = ep_args;
  SmallVector<Resource,_8UL>::SmallVector((SmallVector<Resource,_8UL> *)local_230);
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::clear(&this->entry_point_bindings);
  local_240.this = this;
  local_240.resources = (SmallVector<Resource,_8UL> *)local_230;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_240);
  pRVar3 = VectorView<Resource>::begin((VectorView<Resource> *)local_230);
  pRVar4 = VectorView<Resource>::end((VectorView<Resource> *)local_230);
  ::std::
  stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>
            (pRVar3,pRVar4);
  __begin1 = (Resource *)local_230;
  __end1 = VectorView<Resource>::begin((VectorView<Resource> *)__begin1);
  r = VectorView<Resource>::end((VectorView<Resource> *)__begin1);
  do {
    if (__end1 == r) {
      SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_230);
      return;
    }
    var = (SPIRVariable *)__end1;
    type = (SPIRType *)__end1->var;
    pSStack_280 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)type);
    m._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    switch((int)(var->dereference_chain).buffer_capacity) {
    case 0xf:
      pmVar5 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                            &(pSStack_280->super_IVariant).self);
      sVar6 = VectorView<spirv_cross::Meta::Decoration>::size
                        (&(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>);
      if (sVar6 != 0) {
        if (*(long *)&(var->super_IVariant).self == 0) {
          bVar1 = VectorView<unsigned_int>::empty
                            (&(pSStack_280->array).super_VectorView<unsigned_int>);
          if (bVar1) {
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_7a0,(SPIRVariable *)this);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_7a0 + 0x20),local_7a0);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,
                       (string *)(local_7a0 + 0x20));
            ::std::__cxx11::string::~string((string *)(local_7a0 + 0x20));
            ::std::__cxx11::string::~string((string *)local_7a0);
            local_7a4 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSStack_280->super_IVariant).self);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&this->recursive_inputs,&local_7a4);
            if (sVar10 == 0) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (local_8b0,this,pSStack_280,0);
              ::std::operator+(local_890,(char *)local_8b0);
              to_restrict(this,m._4_4_,true);
              ::std::operator+(local_870,(char *)local_890);
              ::std::operator+(local_850,local_870);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_850)
              ;
              ::std::__cxx11::string::~string((string *)local_850);
              ::std::__cxx11::string::~string((string *)local_870);
              ::std::__cxx11::string::~string((string *)local_890);
              ::std::__cxx11::string::~string(local_8b0);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_828,"void* ",&local_829);
              to_restrict(this,m._4_4_,true);
              ::std::operator+(local_808,(char *)local_828);
              ::std::operator+(local_7e8,local_808);
              ::std::operator+(local_7c8,(char *)local_7e8);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_7c8)
              ;
              ::std::__cxx11::string::~string((string *)local_7c8);
              ::std::__cxx11::string::~string((string *)local_7e8);
              ::std::__cxx11::string::~string((string *)local_808);
              ::std::__cxx11::string::~string(local_828);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
            }
            convert_to_string<unsigned_int,_0>
                      (local_910,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+((char *)local_8f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x421c43);
            ::std::operator+(local_8d0,(char *)local_8f0);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_8d0);
            ::std::__cxx11::string::~string((string *)local_8d0);
            ::std::__cxx11::string::~string(local_8f0);
            ::std::__cxx11::string::~string((string *)local_910);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
          }
          else {
            sVar6 = VectorView<unsigned_int>::size
                              (&(pSStack_280->array).super_VectorView<unsigned_int>);
            if (1 < sVar6) {
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar7,"Arrays of arrays of buffers are not supported.");
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            this->is_using_builtin_array = true;
            bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
            if (bVar1) {
              add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptorArray);
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,", ");
              }
              local_38c = (pSStack_280->super_IVariant).self.id;
              local_385 = Compiler::has_decoration
                                    ((Compiler *)this,(ID)local_38c,DecorationBufferBlock);
              if (((type->basetype == Half) || ((bool)local_385)) &&
                 (((this->msl_options).runtime_array_rich_descriptor & 1U) != 0)) {
                add_spv_func_and_recompile(this,SPVFuncImplVariableSizedDescriptor);
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_430,(SPIRVariable *)this)
                ;
                ::std::operator+(local_430 + 0x20,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"const device spvBufferDescriptor<");
                ::std::operator+(local_3f0,local_430 + 0x20);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_450,this,pSStack_280,0);
                ::std::operator+(local_3d0,local_3f0);
                ::std::operator+(local_3b0,(char *)local_3d0);
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)local_3b0);
                ::std::__cxx11::string::~string((string *)local_3b0);
                ::std::__cxx11::string::~string((string *)local_3d0);
                ::std::__cxx11::string::~string(local_450);
                ::std::__cxx11::string::~string((string *)local_3f0);
                ::std::__cxx11::string::~string((string *)(local_430 + 0x20));
                ::std::__cxx11::string::~string((string *)local_430);
              }
              else {
                add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptor);
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_4f0,(SPIRVariable *)this)
                ;
                ::std::operator+(local_4f0 + 0x20,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"const device spvDescriptor<");
                ::std::operator+(local_4b0,local_4f0 + 0x20);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_510,this,pSStack_280,0);
                ::std::operator+(local_490,local_4b0);
                ::std::operator+(local_470,(char *)local_490);
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)local_470);
                ::std::__cxx11::string::~string((string *)local_470);
                ::std::__cxx11::string::~string((string *)local_490);
                ::std::__cxx11::string::~string(local_510);
                ::std::__cxx11::string::~string((string *)local_4b0);
                ::std::__cxx11::string::~string((string *)(local_4f0 + 0x20));
                ::std::__cxx11::string::~string((string *)local_4f0);
              }
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      to_restrict(this,m._4_4_,true);
              ::std::operator+((char *)local_550,__rhs);
              ::std::operator+(local_530,(char *)local_550);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_530)
              ;
              ::std::__cxx11::string::~string((string *)local_530);
              ::std::__cxx11::string::~string(local_550);
              convert_to_string<unsigned_int,_0>
                        ((spirv_cross *)&i,
                         (uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
              ::std::operator+((char *)local_590,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x421c43);
              ::std::operator+(local_570,(char *)local_590);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_570)
              ;
              ::std::__cxx11::string::~string((string *)local_570);
              ::std::__cxx11::string::~string(local_590);
              ::std::__cxx11::string::~string((string *)&i);
              sVar10 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                               (key_type *)((long)&m + 4));
              if (sVar10 != 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           ", raster_order_group(0)");
              }
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            }
            else {
              local_5b4 = get_resource_array_size(this,pSStack_280,m._4_4_);
              for (local_5b8 = 0; local_5b8 < local_5b4; local_5b8 = local_5b8 + 1) {
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)resources.stack_storage.aligned_char._504_8_,", ");
                }
                get_argument_address_space_abi_cxx11_((CompilerMSL *)local_6b8,(SPIRVariable *)this)
                ;
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_6b8 + 0x20),local_6b8);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_6d8,this,pSStack_280,0);
                ::std::operator+(local_678,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_6b8 + 0x20));
                ::std::operator+(local_658,(char *)local_678);
                to_restrict(this,m._4_4_,true);
                ::std::operator+(local_638,(char *)local_658);
                ::std::operator+(local_618,local_638);
                ::std::operator+(local_5f8,(char *)local_618);
                convert_to_string<unsigned_int,_0>(local_6f8,&local_5b8);
                ::std::operator+(local_5d8,local_5f8);
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)local_5d8);
                ::std::__cxx11::string::~string((string *)local_5d8);
                ::std::__cxx11::string::~string((string *)local_6f8);
                ::std::__cxx11::string::~string((string *)local_5f8);
                ::std::__cxx11::string::~string((string *)local_618);
                ::std::__cxx11::string::~string((string *)local_638);
                ::std::__cxx11::string::~string((string *)local_658);
                ::std::__cxx11::string::~string((string *)local_678);
                ::std::__cxx11::string::~string(local_6d8);
                ::std::__cxx11::string::~string((string *)(local_6b8 + 0x20));
                ::std::__cxx11::string::~string((string *)local_6b8);
                local_75c = *(int *)((long)&(var->dereference_chain).buffer_capacity + 4) +
                            local_5b8;
                convert_to_string<unsigned_int,_0>(local_758,&local_75c);
                ::std::operator+((char *)local_738,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x421c43);
                ::std::operator+(local_718,(char *)local_738);
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)local_718);
                ::std::__cxx11::string::~string((string *)local_718);
                ::std::__cxx11::string::~string(local_738);
                ::std::__cxx11::string::~string((string *)local_758);
                sVar10 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                                 (key_type *)((long)&m + 4));
                if (sVar10 != 0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)resources.stack_storage.aligned_char._504_8_,
                             ", raster_order_group(0)");
                }
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
              }
            }
            this->is_using_builtin_array = false;
          }
        }
        else {
          if ((var->super_IVariant)._vptr_IVariant == *(_func_int ***)&(var->super_IVariant).self) {
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2b8,m._4_4_);
            local_2b4 = Compiler::get_decoration((Compiler *)this,local_2b8,DecorationDescriptorSet)
            ;
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2c0,m._4_4_);
            local_2bc = Compiler::get_decoration((Compiler *)this,local_2c0,DecorationBinding);
            join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                      (local_2b0,(char (*) [18])"spvBufferAliasSet",&local_2b4,
                       (char (*) [8])"Binding",&local_2bc);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_((CompilerMSL *)local_320,(SPIRVariable *)this);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_320 + 0x20),local_320);
            ::std::operator+(local_2e0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_320 + 0x20));
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_2e0);
            ::std::__cxx11::string::~string((string *)local_2e0);
            ::std::__cxx11::string::~string((string *)(local_320 + 0x20));
            ::std::__cxx11::string::~string((string *)local_320);
            convert_to_string<unsigned_int,_0>
                      (local_380,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+((char *)local_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x421c43);
            ::std::operator+(local_340,(char *)local_360);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_340);
            ::std::__cxx11::string::~string((string *)local_340);
            ::std::__cxx11::string::~string(local_360);
            ::std::__cxx11::string::~string((string *)local_380);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            ::std::__cxx11::string::~string((string *)local_2b0);
          }
          local_384 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)((var->super_IVariant)._vptr_IVariant + 1));
          SmallVector<unsigned_int,_8UL>::push_back(&this->buffer_aliases_discrete,&local_384);
        }
      }
      break;
    case 0x10:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      local_a38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      bVar1 = type_is_msl_framebuffer_fetch(this,local_a38);
      if (bVar1) {
        bVar1 = Options::is_macos(&this->msl_options);
        if ((bVar1) && (bVar1 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar1)) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar7,"Framebuffer fetch on Mac is not supported before MSL 2.3.");
          __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (local_bd8,this,pSStack_280,(ulong)m._4_4_,0);
        ::std::operator+(local_bb8,(char *)local_bd8);
        ::std::operator+(local_b98,local_bb8);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_b98);
        ::std::__cxx11::string::~string((string *)local_b98);
        ::std::__cxx11::string::~string((string *)local_bb8);
        ::std::__cxx11::string::~string(local_bd8);
        convert_to_string<unsigned_int,_0>
                  (local_c38,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_c18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         " [[color(");
        ::std::operator+(local_bf8,(char *)local_c18);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_bf8);
        ::std::__cxx11::string::~string((string *)local_bf8);
        ::std::__cxx11::string::~string(local_c18);
        ::std::__cxx11::string::~string((string *)local_c38);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (local_a98,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_a78,(char *)local_a98);
        ::std::operator+(local_a58,local_a78);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_a58);
        ::std::__cxx11::string::~string((string *)local_a58);
        ::std::__cxx11::string::~string((string *)local_a78);
        ::std::__cxx11::string::~string(local_a98);
        if (*(int *)(var->dereference_chain).stack_storage.aligned_char != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (local_ab8,&this->plane_name_suffix,
                     (uint *)&(var->dereference_chain).stack_storage);
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_ab8);
          ::std::__cxx11::string::~string((string *)local_ab8);
        }
        bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
        if (bVar1) {
          convert_to_string<unsigned_int,_0>
                    (local_b18,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
          ::std::operator+((char *)local_af8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "_ [[buffer(");
          ::std::operator+(local_ad8,(char *)local_af8);
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_ad8);
          ::std::__cxx11::string::~string((string *)local_ad8);
          ::std::__cxx11::string::~string(local_af8);
          ::std::__cxx11::string::~string((string *)local_b18);
        }
        else {
          convert_to_string<unsigned_int,_0>
                    (local_b78,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
          ::std::operator+((char *)local_b58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           " [[texture(");
          ::std::operator+(local_b38,(char *)local_b58);
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_b38);
          ::std::__cxx11::string::~string((string *)local_b38);
          ::std::__cxx11::string::~string(local_b58);
          ::std::__cxx11::string::~string((string *)local_b78);
        }
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      flags._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->atomic_image_vars_emulated,(key_type *)((long)&flags + 4));
      if (sVar10 != 0) {
        cv_flags._4_4_ = (type->super_IVariant).self.id;
        local_c48 = ParsedIR::get_decoration_bitset
                              (&(this->super_CompilerGLSL).super_Compiler.ir,cv_flags._4_4_);
        bVar1 = decoration_flags_signal_volatile(local_c48);
        local_c58 = (TypedID<(spirv_cross::Types)0> *)0x400321;
        if (bVar1) {
          local_c58 = (TypedID<(spirv_cross::Types)0> *)0x420a41;
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_a38->image);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_c98,this,pSVar9,0);
        join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                  (local_c78,(char (*) [3])0x421228,(char **)&local_c58,
                   (char (*) [15])"device atomic_",local_c98);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_c78);
        ::std::__cxx11::string::~string((string *)local_c78);
        ::std::__cxx11::string::~string((string *)local_c98);
        ::std::operator+((char *)local_cd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x4245d4);
        ::std::operator+(local_cb8,(char *)local_cd8);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_cb8);
        ::std::__cxx11::string::~string((string *)local_cb8);
        ::std::__cxx11::string::~string(local_cd8);
        convert_to_string<unsigned_int,_0>
                  ((spirv_cross *)&parent_type,
                   (uint *)((var->dereference_chain).stack_storage.aligned_char + 4));
        ::std::operator+((char *)local_d18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x421c43);
        ::std::operator+(local_cf8,(char *)local_d18);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_cf8);
        ::std::__cxx11::string::~string((string *)local_cf8);
        ::std::__cxx11::string::~string(local_d18);
        ::std::__cxx11::string::~string((string *)&parent_type);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      break;
    default:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      if ((pSStack_280->pointer & 1U) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc)
        ;
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        get_type_address_space_abi_cxx11_
                  ((CompilerMSL *)local_fc0,(SPIRType *)this,(uint32_t)pSVar9,SUB41(m._4_4_,0));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_fc0 + 0x20),local_fc0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_fe0,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_f80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_fc0 + 0x20));
        ::std::operator+(local_f60,(char *)local_f80);
        ::std::operator+(local_f40,local_f60);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_f40);
        ::std::__cxx11::string::~string((string *)local_f40);
        ::std::__cxx11::string::~string((string *)local_f60);
        ::std::__cxx11::string::~string((string *)local_f80);
        ::std::__cxx11::string::~string(local_fe0);
        ::std::__cxx11::string::~string((string *)(local_fc0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_fc0);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_1040,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_1020,(char *)local_1040);
        ::std::operator+(local_1000,local_1020);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_1000);
        ::std::__cxx11::string::~string((string *)local_1000);
        ::std::__cxx11::string::~string((string *)local_1020);
        ::std::__cxx11::string::~string(local_1040);
      }
      convert_to_string<unsigned_int,_0>
                (local_10a0,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
      ::std::operator+((char *)local_1080,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x421c43
                      );
      ::std::operator+(local_1060,(char *)local_1080);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_1060);
      ::std::__cxx11::string::~string((string *)local_1060);
      ::std::__cxx11::string::~string(local_1080);
      ::std::__cxx11::string::~string((string *)local_10a0);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                       (key_type *)((long)&m + 4));
      if (sVar10 != 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", raster_order_group(0)")
        ;
      }
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      break;
    case 0x12:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      sampler_type_abi_cxx11_
                ((CompilerMSL *)local_970,(SPIRType *)this,(uint32_t)pSStack_280,SUB41(m._4_4_,0));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_970 + 0x20),local_970);
      ::std::operator+(local_930,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_970 + 0x20));
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_930);
      ::std::__cxx11::string::~string((string *)local_930);
      ::std::__cxx11::string::~string((string *)(local_970 + 0x20));
      ::std::__cxx11::string::~string((string *)local_970);
      bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
      if (bVar1) {
        convert_to_string<unsigned_int,_0>
                  (local_9d0,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_9b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "_ [[buffer(");
        ::std::operator+(local_990,(char *)local_9b0);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_990);
        ::std::__cxx11::string::~string((string *)local_990);
        ::std::__cxx11::string::~string(local_9b0);
        ::std::__cxx11::string::~string((string *)local_9d0);
      }
      else {
        convert_to_string<unsigned_int,_0>
                  ((spirv_cross *)&basetype,
                   (uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_a10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         " [[sampler(");
        ::std::operator+(local_9f0,(char *)local_a10);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_9f0);
        ::std::__cxx11::string::~string((string *)local_9f0);
        ::std::__cxx11::string::~string(local_a10);
        ::std::__cxx11::string::~string((string *)&basetype);
      }
      break;
    case 0x13:
      bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
      if (bVar1) {
        add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptor);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_280->parent_type);
        local_d40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,", ");
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_e00,this,local_d40,0);
        ::std::operator+((char *)local_de0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "const device spvDescriptor<");
        ::std::operator+(local_dc0,(char *)local_de0);
        to_restrict(this,m._4_4_,true);
        ::std::operator+(local_da0,(char *)local_dc0);
        ::std::operator+(local_d80,local_da0);
        ::std::operator+(local_d60,(char *)local_d80);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_d60);
        ::std::__cxx11::string::~string((string *)local_d60);
        ::std::__cxx11::string::~string((string *)local_d80);
        ::std::__cxx11::string::~string((string *)local_da0);
        ::std::__cxx11::string::~string((string *)local_dc0);
        ::std::__cxx11::string::~string(local_de0);
        ::std::__cxx11::string::~string(local_e00);
        convert_to_string<unsigned_int,_0>
                  (local_e60,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_e40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x421c43);
        ::std::operator+(local_e20,(char *)local_e40);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_e20);
        ::std::__cxx11::string::~string((string *)local_e20);
        ::std::__cxx11::string::~string(local_e40);
        ::std::__cxx11::string::~string((string *)local_e60);
      }
      else {
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,", ");
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_ec0,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(local_ea0,(char *)local_ec0);
        ::std::operator+(local_e80,local_ea0);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_e80);
        ::std::__cxx11::string::~string((string *)local_e80);
        ::std::__cxx11::string::~string((string *)local_ea0);
        ::std::__cxx11::string::~string(local_ec0);
        convert_to_string<unsigned_int,_0>
                  (local_f20,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+((char *)local_f00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x421c43);
        ::std::operator+(local_ee0,(char *)local_f00);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)local_ee0);
        ::std::__cxx11::string::~string((string *)local_ee0);
        ::std::__cxx11::string::~string(local_f00);
        ::std::__cxx11::string::~string((string *)local_f20);
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *discrete_descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	entry_point_bindings.clear();
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);
			uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				if (descriptor_set_is_argument_buffer(desc_set))
				{
					if (is_var_runtime_size_array(var))
					{
						// Runtime arrays need to be wrapped in spvDescriptorArray from argument buffer payload.
						entry_point_bindings.push_back(&var);
						// We'll wrap this, so to_name() will always use non-qualified name.
						// We'll need the qualified name to create temporary variable instead.
						ir.meta[var_id].decoration.qualified_alias_explicit_override = true;
					}
					return;
				}
			}

			// Handle descriptor aliasing of simple discrete cases.
			// We can handle aliasing of buffers by casting pointers.
			// The amount of aliasing we can perform for discrete descriptors is very limited.
			// For fully mutable-style aliasing, we need argument buffers where we can exploit the fact
			// that descriptors are all 8 bytes.
			SPIRVariable *discrete_descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						discrete_descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.discrete_descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars_emulated.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				entry_point_bindings.push_back(&var);
				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), SPIRType::Image,
					                     get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({&var, discrete_descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                     get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!discrete_descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				entry_point_bindings.push_back(&var);
				resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), type.basetype,
				                     resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(),
	            [](const Resource &lhs, const Resource &rhs)
	            { return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index); });

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.discrete_descriptor_alias)
			{
				if (r.var == r.discrete_descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				is_using_builtin_array = true;
				if (is_var_runtime_size_array(var))
				{
					add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
					if (!ep_args.empty())
						ep_args += ", ";
					const bool ssbo = has_decoration(type.self, DecorationBufferBlock);
					if ((var.storage == spv::StorageClassStorageBuffer || ssbo) &&
					    msl_options.runtime_array_rich_descriptor)
					{
						add_spv_func_and_recompile(SPVFuncImplVariableSizedDescriptor);
						ep_args += "const device spvBufferDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					else
					{
						add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
						ep_args += "const device spvDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					ep_args += to_restrict(var_id, true) + r.name + "_";
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				else
				{
					uint32_t array_size = get_resource_array_size(type, var_id);
					for (uint32_t i = 0; i < array_size; ++i)
					{
						if (!ep_args.empty())
							ep_args += ", ";
						ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " +
						           to_restrict(var_id, true) + r.name + "_" + convert_to_string(i);
						ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
						if (interlocked_resources.count(var_id))
							ep_args += ", raster_order_group(0)";
						ep_args += "]]";
					}
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += get_argument_address_space(var) + " ";

				if (recursive_inputs.count(type.self))
					ep_args += string("void* ") + to_restrict(var_id, true) + r.name + "_vp";
				else
					ep_args += type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;

				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id, false) + " " + r.name;
			if (is_var_runtime_size_array(var))
				ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")]]";
			else
				ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);

				if (is_var_runtime_size_array(var))
					ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")";
				else
					ep_args += " [[texture(" + convert_to_string(r.index) + ")";

				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars_emulated.count(var.self))
			{
				auto &flags = ir.get_decoration_bitset(var.self);
				const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
				ep_args += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(basetype.image.type), 0));
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
		{
			if (is_var_runtime_size_array(var))
			{
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
				const auto &parent_type = get<SPIRType>(type.parent_type);
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += "const device spvDescriptor<" + type_to_glsl(parent_type) + ">* " +
				           to_restrict(var_id, true) + r.name + "_";
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			break;
		}
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}